

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O2

int cfg_schema_validate(cfg_db *db,_Bool cleanup,_Bool ignore_unknown,autobuf *out)

{
  list_entity *array;
  avl_node **tree;
  list_entity **pplVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  byte bVar5;
  int iVar6;
  avl_node *paVar7;
  avl_node *paVar8;
  char *pcVar9;
  avl_node *paVar10;
  list_entity *plVar11;
  size_t sVar12;
  byte bVar13;
  list_entity *plVar14;
  avl_node *paVar15;
  cfg_schema *tree_00;
  cfg_schema *pcVar16;
  list_entity *plVar17;
  list_entity *__s;
  bool bVar18;
  bool bVar19;
  list_entity **local_1b8;
  list_entity *local_178;
  list_entity *local_148;
  list_entity *local_140;
  char section_name [256];
  
  if (db->schema == (cfg_schema *)0x0) {
    iVar6 = -1;
  }
  else {
    bVar13 = 0;
    plVar2 = (db->sectiontypes).list_head.next;
LAB_0010c8c6:
    while (plVar14 = plVar2, tree_00 = db->schema, pcVar16 = tree_00,
          plVar14->prev != (db->sectiontypes).list_head.prev) {
      plVar2 = plVar14->next;
      paVar7 = avl_find(&tree_00->sections,plVar14[3].prev);
      if (paVar7 != (avl_node *)0x0) goto LAB_0010c92e;
      if (!ignore_unknown) {
        cfg_append_printable_line(out,"Cannot find schema for section type \'%s\'",plVar14[3].prev);
        bVar13 = 1;
        if (cleanup) goto LAB_0010cc65;
      }
    }
    while (tree_00 = (cfg_schema *)(tree_00->sections).list_head.next,
          (tree_00->sections).list_head.prev != (pcVar16->sections).list_head.prev) {
      paVar7 = avl_find(&db->sectiontypes,(tree_00->entries).root);
      if (*(int *)&(tree_00->entries).comp == 2) {
        if (((paVar7 == (avl_node *)0x0) || (*(int *)&paVar7[1].key == 0)) ||
           (*(int *)&paVar7[1].key == 1 && paVar7[1].parent[1].list.next == (list_entity *)0x0)) {
          cfg_append_printable_line
                    (out,"Missing mandatory section of type \'%s\'",(tree_00->entries).root);
          bVar5 = 1;
        }
        else {
          bVar5 = 0;
        }
        bVar13 = bVar13 | bVar5;
      }
      tree = &paVar7[1].parent;
      for (paVar8 = (avl_node *)0x0; paVar8 < tree_00[1].entries.root;
          paVar8 = (avl_node *)((long)&(paVar8->list).next + 1)) {
        if ((paVar7 != (avl_node *)0x0) &&
           (plVar2 = tree_00[1].entries.list_head.prev,
           *(long *)((long)plVar2 + (long)paVar8 * 200 + 0x50) == 0)) {
          paVar10 = avl_find((avl_tree *)tree,(void *)0x0);
          paVar15 = (avl_node *)tree;
          if ((paVar10 == (avl_node *)0x0) ||
             (paVar10 = avl_find((avl_tree *)&paVar10[1].parent,
                                 *(void **)((long)plVar2 + (long)paVar8 * 200 + 0x48)),
             paVar10 == (avl_node *)0x0)) {
            do {
              paVar15 = (avl_node *)(paVar15->list).next;
              if ((avl_node *)(paVar15->list).prev == paVar7[1].left) {
                bVar5 = 0;
                goto LAB_0010cda0;
              }
            } while ((paVar15[1].list.next == (list_entity *)0x0) ||
                    (paVar10 = avl_find((avl_tree *)&paVar15[1].parent,
                                        *(void **)((long)plVar2 + (long)paVar8 * 200 + 0x48)),
                    paVar10 != (avl_node *)0x0));
            cfg_append_printable_line
                      (out,"Missing mandatory entry of type \'%s\', name \'%s\' and key \'%s\'",
                       (tree_00->entries).root,paVar15[1].list.next,
                       *(undefined8 *)((long)plVar2 + (long)paVar8 * 200 + 0x48));
            bVar5 = 1;
          }
          else {
            bVar5 = 0;
          }
LAB_0010cda0:
          bVar13 = bVar13 | bVar5;
        }
      }
      pcVar16 = db->schema;
    }
    iVar6 = -(uint)bVar13;
  }
  return iVar6;
LAB_0010c92e:
  pplVar1 = &plVar14[3].prev;
  paVar8 = avl_find_lessequal(&db->schema->sections,plVar14[3].prev);
  for (; (avl_node *)(paVar7->list).prev != paVar8; paVar7 = (avl_node *)(paVar7->list).next) {
    plVar3 = plVar14[4].prev;
LAB_0010c977:
    while (local_178 = plVar3, local_178->prev != plVar14[5].next) {
      plVar3 = local_178->next;
      plVar17 = local_178[3].prev;
      if (plVar17 == (list_entity *)0x0) {
        plVar17 = (list_entity *)0x11838f;
        pcVar9 = "";
        goto LAB_0010ca4f;
      }
      bVar18 = *(int *)&paVar7[1].parent == 0;
      if (bVar18) {
        cfg_append_printable_line
                  (out,
                   "The section type \'%s\' has to be used without a name (\'%s\' was given as a name)"
                   ,*pplVar1,plVar17);
        plVar17 = local_178[3].prev;
      }
      pcVar9 = strchr((char *)plVar17,0x20);
      bVar19 = pcVar9 != (char *)0x0;
      if (bVar19) {
        cfg_append_printable_line
                  (out,"The section name \'%s\' for type \'%s\' contains illegal characters",plVar17
                   ,*pplVar1);
      }
      if (!bVar19 && !bVar18 || !cleanup) goto LAB_0010ca39;
      cfg_db_remove_namedsection(db,(char *)*pplVar1,(char *)local_178[3].prev);
      bVar13 = (bVar19 || bVar18) | bVar13;
    }
  }
  if ((cleanup) && (*(int *)&plVar14[6].next == 0)) {
LAB_0010cc65:
    local_1b8 = &plVar14[3].prev;
    cfg_db_remove_sectiontype(db,(char *)*local_1b8);
  }
  goto LAB_0010c8c6;
LAB_0010ca39:
  bVar13 = bVar13 | (bVar19 || bVar18);
  if (!bVar19 && !bVar18) {
    plVar17 = local_178[3].prev;
    pcVar9 = "=";
LAB_0010ca4f:
    snprintf(section_name,0x100,"\'%s%s%s\'",*pplVar1,pcVar9,plVar17);
    plVar17 = local_178[4].prev;
    while (plVar17->prev != local_178[5].next) {
      plVar4 = plVar17->next;
      local_148 = *pplVar1;
      local_140 = plVar17[3].prev;
      paVar10 = avl_find(&db->schema->entries,&local_148);
      array = plVar17 + 4;
      bVar5 = 0;
      bVar18 = false;
      for (paVar15 = paVar10;
          ((paVar15 != (avl_node *)0x0 && (paVar15 != (avl_node *)&db->schema->entries)) &&
          ((paVar15 == paVar10 || (paVar15->follower == true))));
          paVar15 = (avl_node *)(paVar15->list).next) {
        if (paVar15[2].list.next != (list_entity *)0x0) {
          bVar18 = false;
          plVar11 = array->next;
          __s = plVar11;
          while (plVar11 != (list_entity *)0x0) {
            if ((list_entity *)((long)&(plVar17[4].prev)->next + (long)&plVar11->next) <= __s)
            goto LAB_0010cbb1;
            if ((!bVar18) &&
               (iVar6 = (*(code *)paVar15[2].list.next)(paVar15,section_name,__s,out), iVar6 != 0))
            {
              bVar5 = 1;
            }
            if (((bVar5 | bVar18) & cleanup) == 1) {
              strarray_remove_ext((strarray *)array,(char *)__s,false);
            }
            else {
              sVar12 = strlen((char *)__s);
              __s = (list_entity *)((long)&__s->next + sVar12 + 1);
            }
            if (paVar15[1].balance == '\0') {
              bVar18 = true;
            }
            plVar11 = array->next;
          }
          cfg_db_remove_entry(db,(char *)*pplVar1,(char *)local_178[3].prev,(char *)plVar17[3].prev)
          ;
        }
LAB_0010cbb1:
        bVar18 = true;
      }
      if (!bVar18 && !ignore_unknown) {
        cfg_append_printable_line
                  (out,"Entry \'%s\' in section %s is unknown",plVar17[3].prev,section_name);
        bVar5 = 1;
      }
      bVar13 = bVar5 | bVar13;
      plVar17 = plVar4;
    }
    if (((bVar13 == 0) && (paVar7[1].right != (avl_node *)0x0)) &&
       (iVar6 = (*(code *)paVar7[1].right)(section_name,local_178,out), iVar6 != 0)) {
      bVar13 = 1;
    }
  }
  goto LAB_0010c977;
}

Assistant:

int
cfg_schema_validate(struct cfg_db *db, bool cleanup, bool ignore_unknown, struct autobuf *out) {
  char section_name[256];
  struct cfg_section_type *section, *section_it;
  struct cfg_named_section *named, *named_it;
  struct cfg_entry *entry, *entry_it;

  struct cfg_schema_section *schema_section;
  struct cfg_schema_section *schema_section_first, *schema_section_last;
  struct cfg_schema_entry *schema_entry;
  size_t i;

  bool error = false;
  bool warning = false;
  bool hasName = false;

  if (db->schema == NULL) {
    return -1;
  }

  CFG_FOR_ALL_SECTION_TYPES(db, section, section_it) {
    /* check for missing schema sections */
    schema_section_first = avl_find_element(&db->schema->sections, section->type, schema_section_first, _section_node);

    if (schema_section_first == NULL) {
      if (ignore_unknown) {
        continue;
      }

      cfg_append_printable_line(out, "Cannot find schema for section type '%s'", section->type);

      if (cleanup) {
        cfg_db_remove_sectiontype(db, section->type);
      }

      error |= true;
      continue;
    }

    schema_section_last = avl_find_le_element(&db->schema->sections, section->type, schema_section_last, _section_node);

    /* iterate over all schema for a certain section type */
    avl_for_element_range(schema_section_first, schema_section_last, schema_section, _section_node) {
      /* check data of named sections in db */
      CFG_FOR_ALL_SECTION_NAMES(section, named, named_it) {
        warning = false;
        hasName = cfg_db_is_named_section(named);

        if (hasName) {
          if (schema_section->mode == CFG_SSMODE_UNNAMED) {
            cfg_append_printable_line(out,
              "The section type '%s'"
              " has to be used without a name"
              " ('%s' was given as a name)",
              section->type, named->name);

            warning = true;
          }
        }

        if (hasName && !cfg_is_allowed_section_name(named->name)) {
          cfg_append_printable_line(out,
            "The section name '%s' for"
            " type '%s' contains illegal characters",
            named->name, section->type);
          warning = true;
        }

        /* test abort condition */
        if (warning && cleanup) {
          /* remove bad named section */
          cfg_db_remove_namedsection(db, section->type, named->name);
        }

        error |= warning;

        if (warning) {
          continue;
        }

        /* initialize section_name field for validate */
        snprintf(section_name, sizeof(section_name), "'%s%s%s'", section->type, hasName ? "=" : "",
          hasName ? named->name : "");

        /* check for bad values */
        CFG_FOR_ALL_ENTRIES(named, entry, entry_it) {
          warning = _validate_cfg_entry(db, section, named, entry, section_name, cleanup, ignore_unknown, out);
          error |= warning;
        }

        /* check custom section validation if everything was fine */
        if (!error && schema_section->cb_validate != NULL) {
          if (schema_section->cb_validate(section_name, named, out)) {
            error = true;
          }
        }
      }
    }
    if (cleanup && avl_is_empty(&section->names)) {
      /* if section type is empty, remove it too */
      cfg_db_remove_sectiontype(db, section->type);
    }
  }

  avl_for_each_element(&db->schema->sections, schema_section, _section_node) {
    section = cfg_db_find_sectiontype(db, schema_section->type);
    if (schema_section->mode == CFG_SSMODE_NAMED_MANDATORY) {
      /* search for missing mandatory sections */
      if (section == NULL || avl_is_empty(&section->names)) {
        warning = true;
      }
      else {
        named = avl_first_element(&section->names, named, node);
        warning = !cfg_db_is_named_section(named) && section->names.count < 2;
      }
      if (warning) {
        cfg_append_printable_line(out, "Missing mandatory section of type '%s'", schema_section->type);
      }
      error |= warning;
    }

    /* check for missing values */
    for (i = 0; i < schema_section->entry_count; i++) {
      schema_entry = &schema_section->entries[i];
      if (section && strarray_is_empty_c(&schema_entry->def)) {
        /* found a mandatory schema entry */

        warning = true;
        named = cfg_db_get_unnamed_section(section);
        if (named) {
          /* entry not in unnamed section */
          warning = cfg_db_get_entry(named, schema_entry->key.entry) == NULL;
        }
        if (warning) {
          /* no mandatory value in unnamed section, check named sections */
          warning = false;

          avl_for_each_element(&section->names, named, node) {
            if (named->name != NULL && cfg_db_get_entry(named, schema_entry->key.entry) == NULL) {
              /* found a named section without mandatory entry */
              warning = true;
              cfg_append_printable_line(
                out, "Missing mandatory entry of type '%s', name '%s' and key '%s'",
                schema_section->type, named->name, schema_entry->key.entry);
              break;
            }
          }
        }
        error |= warning;
      }
    }
  }
  return error ? -1 : 0;
}